

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SCC.h
# Opt level: O0

void __thiscall dg::SCC<dg::pta::PSNode>::SCC(SCC<dg::pta::PSNode> *this)

{
  long in_RDI;
  CachingHashMap<dg::pta::PSNode_*,_dg::SCC<dg::pta::PSNode>::NodeInfo,_4U> *unaff_retaddr;
  
  ADT::QueueLIFO<dg::pta::PSNode_*>::QueueLIFO((QueueLIFO<dg::pta::PSNode_*> *)0x1588c8);
  CachingHashMap<dg::pta::PSNode_*,_dg::SCC<dg::pta::PSNode>::NodeInfo,_4U>::CachingHashMap
            (unaff_retaddr);
  *(undefined4 *)(in_RDI + 0xd0) = 0;
  std::
  vector<std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>,_std::allocator<std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>_>_>
  ::vector((vector<std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>,_std::allocator<std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>_>_>
            *)0x1588f1);
  return;
}

Assistant:

SCC<NodeT>() = default;